

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O1

size_t ecMulA_deep(size_t n,size_t ec_d,size_t ec_deep,size_t m)

{
  byte bVar1;
  ulong uVar2;
  
  uVar2 = m << 6;
  bVar1 = 4;
  if ((uVar2 < 0x150) && (bVar1 = 3, uVar2 < 0x78)) {
    bVar1 = 2 - (uVar2 == 0);
  }
  return ec_deep + m * 0x10 + ((ec_d * n << (bVar1 & 0x3f)) + ec_d * n) * 8 + 8;
}

Assistant:

size_t ecMulA_deep(size_t n, size_t ec_d, size_t ec_deep, size_t m)
{
	const size_t naf_width = ecNAFWidth(B_OF_W(m));
	const size_t naf_count = SIZE_1 << (naf_width - 2);
	return O_OF_W(2 * m + 1) + 
		O_OF_W(ec_d * n) + 
		O_OF_W(ec_d * n * naf_count) + 
		ec_deep;
}